

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O1

void slang::ast::enforceNondegeneracy
               (AssertionExpr *expr,ASTContext *context,NondegeneracyRequirement nondegRequirement,
               SyntaxNode *syntax)

{
  Diagnostic *this;
  DiagCode code;
  SourceRange range;
  SourceRange sourceRange;
  NondegeneracyCheckResult seqNondegen;
  NondegeneracyCheckResult local_48;
  
  AssertionExpr::checkNondegeneracy(&local_48,expr);
  if ((local_48.status.m_bits & 4) == 0) {
    if (nondegRequirement == NonOverlapOp) {
      return;
    }
    if (nondegRequirement == OverlapOp) {
      if ((local_48.status.m_bits & 2) == 0) {
        return;
      }
      range = slang::syntax::SyntaxNode::sourceRange(syntax);
      code.subsystem = Statements;
      code.code = 0x45;
    }
    else {
      if ((local_48.status.m_bits & 1) == 0) {
        return;
      }
      range = slang::syntax::SyntaxNode::sourceRange(syntax);
      code.subsystem = Statements;
      code.code = 0x43;
    }
  }
  else {
    if (((ulong)local_48.noMatchRange.startLoc & 0xfffffff) == 0) {
      range = slang::syntax::SyntaxNode::sourceRange(syntax);
    }
    else {
      range.endLoc = local_48.noMatchRange.endLoc;
      range.startLoc = local_48.noMatchRange.startLoc;
    }
    if (local_48.isAlwaysFalse == true) {
      sourceRange = slang::syntax::SyntaxNode::sourceRange(syntax);
      this = ASTContext::addDiag(context,(DiagCode)0x5d0008,sourceRange);
      Diagnostic::addNote(this,(DiagCode)0x530008,range);
      return;
    }
    code.subsystem = Statements;
    code.code = 0x5d;
  }
  ASTContext::addDiag(context,code,range);
  return;
}

Assistant:

static void enforceNondegeneracy(const AssertionExpr& expr, const ASTContext& context,
                                 AssertionExpr::NondegeneracyRequirement nondegRequirement,
                                 const SyntaxNode& syntax) {
    using NR = AssertionExpr::NondegeneracyRequirement;
    const auto seqNondegen = expr.checkNondegeneracy();
    const auto seqNondegenSt = seqNondegen.status;
    if (seqNondegenSt.has(NondegeneracyStatus::AdmitsNoMatch)) {
        auto range = seqNondegen.noMatchRange;
        if (!range.start())
            range = syntax.sourceRange();

        if (seqNondegen.isAlwaysFalse) {
            auto& diag = context.addDiag(diag::SeqNoMatch, syntax.sourceRange());
            diag.addNote(diag::NoteAlwaysFalse, range);
        }
        else {
            context.addDiag(diag::SeqNoMatch, range);
        }
    }
    else if (nondegRequirement == NR::OverlapOp) {
        if (seqNondegenSt.has(NondegeneracyStatus::AcceptsOnlyEmpty))
            context.addDiag(diag::SeqOnlyEmpty, syntax.sourceRange());
    }
    else if (nondegRequirement != NR::NonOverlapOp) {
        if (seqNondegenSt.has(NondegeneracyStatus::AdmitsEmpty))
            context.addDiag(diag::SeqEmptyMatch, syntax.sourceRange());
    }
}